

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

Origin ON_Font::FontOriginFromUnsigned(uint unsigned_font_origin)

{
  if (3 < unsigned_font_origin) {
    unsigned_font_origin = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
               ,0x303f,"","Invalid unsigned_font_origin value.");
  }
  return (Origin)unsigned_font_origin;
}

Assistant:

ON_Font::Origin ON_Font::FontOriginFromUnsigned(
  unsigned int unsigned_font_origin
)
{
  switch (unsigned_font_origin)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Origin::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Origin::Unknown);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Origin::WindowsFont);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Origin::AppleFont);
  };

  ON_ERROR("Invalid unsigned_font_origin value.");
  return ON_Font::Origin::Unset;
}